

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpnSave.c
# Opt level: O3

void Npn_ManResize(Npn_Man_t *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *__ptr;
  Npn_Obj_t *pNVar5;
  word wVar6;
  uint uVar7;
  int *piVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  Npn_Obj_t *pNVar14;
  Npn_Obj_t *pNVar15;
  Npn_Obj_t *pNVar16;
  size_t __nmemb;
  bool bVar17;
  timespec ts;
  timespec local_40;
  
  if (p->pBins == (int *)0x0) {
    __assert_fail("p->pBins != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcNpnSave.c"
                  ,0x18d,"void Npn_ManResize(Npn_Man_t *)");
  }
  clock_gettime(3,&local_40);
  __ptr = p->pBins;
  uVar1 = p->nBins;
  uVar10 = uVar1 * 3 - 1;
  while( true ) {
    do {
      uVar11 = uVar10 + 1;
      uVar7 = uVar10 & 1;
      uVar10 = uVar11;
    } while (uVar7 != 0);
    if (uVar11 < 9) break;
    iVar12 = 5;
    while (uVar11 % (iVar12 - 2U) != 0) {
      uVar7 = iVar12 * iVar12;
      iVar12 = iVar12 + 2;
      if (uVar11 < uVar7) goto LAB_00283642;
    }
  }
LAB_00283642:
  p->nBins = uVar11;
  __nmemb = (size_t)(int)uVar11;
  piVar8 = (int *)calloc(__nmemb,4);
  p->pBins = piVar8;
  if ((int)uVar1 < 1) {
    iVar12 = 1;
  }
  else {
    iVar2 = p->nBufferSize;
    iVar12 = 1;
    uVar13 = 0;
    do {
      iVar3 = __ptr[uVar13];
      if (iVar2 <= iVar3) {
LAB_0028378b:
        __assert_fail("i < p->nBufferSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcNpnSave.c"
                      ,0x31,"Npn_Obj_t *Npn_ManObj(Npn_Man_t *, int)");
      }
      if (iVar3 != 0) {
        pNVar16 = p->pBuffer;
        iVar4 = pNVar16[iVar3].iNext;
        if (iVar2 <= iVar4) goto LAB_0028378b;
        pNVar14 = pNVar16 + iVar3;
        pNVar5 = p->pBuffer;
        wVar6 = pNVar14->uTruth;
        lVar9 = (long)(int)((wVar6 * 0x6f1 ^ wVar6 * 0x2dd ^ wVar6 * 0x65) % __nmemb);
        pNVar14->iNext = piVar8[lVar9];
        if (pNVar14 <= pNVar5) {
LAB_002837aa:
          __assert_fail("p->pBuffer < pObj",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcNpnSave.c"
                        ,0x32,"int Npn_ManObjNum(Npn_Man_t *, Npn_Obj_t *)");
        }
        pNVar15 = (Npn_Obj_t *)0x0;
        if (iVar4 != 0) {
          pNVar15 = pNVar16 + iVar4;
        }
        while( true ) {
          iVar12 = iVar12 + 1;
          piVar8[lVar9] = (int)((ulong)((long)pNVar14 - (long)pNVar5) >> 4);
          if (pNVar15 == (Npn_Obj_t *)0x0) break;
          iVar3 = pNVar15->iNext;
          if (iVar2 <= iVar3) goto LAB_0028378b;
          pNVar16 = pNVar5 + iVar3;
          if (iVar3 == 0) {
            pNVar16 = (Npn_Obj_t *)0x0;
          }
          wVar6 = pNVar15->uTruth;
          lVar9 = (long)(int)((wVar6 * 0x6f1 ^ wVar6 * 0x2dd ^ wVar6 * 0x65) % __nmemb);
          pNVar15->iNext = piVar8[lVar9];
          bVar17 = pNVar15 <= pNVar5;
          pNVar14 = pNVar15;
          pNVar15 = pNVar16;
          if (bVar17) goto LAB_002837aa;
        }
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar1);
  }
  if (iVar12 != p->nEntries) {
    __assert_fail("Counter == p->nEntries",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcNpnSave.c"
                  ,0x1a5,"void Npn_ManResize(Npn_Man_t *)");
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  return;
}

Assistant:

void Npn_ManResize( Npn_Man_t * p )
{
    Npn_Obj_t * pEntry, * pNext;
    int * pBinsOld, * ppPlace;
    int nBinsOld, Counter, i;
    abctime clk;
    assert( p->pBins != NULL );
clk = Abc_Clock();
    // save the old Bins
    pBinsOld = p->pBins;
    nBinsOld = p->nBins;
    // get the new Bins
    p->nBins = Abc_PrimeCudd( 3 * nBinsOld ); 
    p->pBins = ABC_CALLOC( int, p->nBins );
    // rehash the entries from the old table
    Counter = 1;
    for ( i = 0; i < nBinsOld; i++ )
    for ( pEntry = Npn_ManObj(p, pBinsOld[i]), 
          pNext = pEntry ? Npn_ManObj(p, pEntry->iNext) : NULL; 
          pEntry; 
          pEntry = pNext, 
          pNext = pEntry ? Npn_ManObj(p, pEntry->iNext) : NULL )
    {
        // get the place where this entry goes 
        ppPlace = p->pBins + Npn_ManHash( p, pEntry->uTruth );
        // add the entry to the list
        pEntry->iNext = *ppPlace;
        *ppPlace = Npn_ManObjNum( p, pEntry );
        Counter++;
    }
    assert( Counter == p->nEntries );
    ABC_FREE( pBinsOld );
//ABC_PRT( "Hash table resizing time", Abc_Clock() - clk );
}